

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void __thiscall AActor::RestoreSpecialPosition(AActor *this)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  double dVar5;
  TFlags<ActorFlag,_unsigned_int> local_44;
  double local_40;
  double space;
  undefined1 local_30 [8];
  FLinkContext ctx;
  DVector2 sp;
  AActor *this_local;
  
  TVector2<double>::TVector2((TVector2<double> *)&ctx.render_list,&this->SpawnPoint);
  FLinkContext::FLinkContext((FLinkContext *)local_30);
  UnlinkFromWorld(this,(FLinkContext *)local_30);
  SetXY(this,(DVector2 *)&ctx.render_list);
  LinkToWorld(this,(FLinkContext *)local_30,true,(sector_t *)0x0);
  dVar5 = secplane_t::ZatPoint(&this->Sector->floorplane,(DVector2 *)&ctx.render_list);
  SetZ(this,dVar5,true);
  P_FindFloorCeiling(this,0x11);
  iVar1 = (int)this;
  TFlags<ActorFlag,_unsigned_int>::operator&
            ((TFlags<ActorFlag,_unsigned_int> *)((long)&space + 4),
             iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
  uVar3 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&space + 4));
  if (uVar3 == 0) {
    TFlags<ActorFlag2,_unsigned_int>::operator&
              ((TFlags<ActorFlag2,_unsigned_int> *)&space,
               iVar1 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
    uVar3 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&space);
    if (uVar3 == 0) {
      SetZ(this,(this->SpawnPoint).Z + this->floorz,true);
    }
    else {
      local_40 = (this->ceilingz - this->Height) - this->floorz;
      if (local_40 <= 48.0) {
        SetZ(this,this->floorz,true);
      }
      else {
        dVar5 = local_40 - 40.0;
        local_40 = dVar5;
        iVar4 = FRandom::operator()(&pr_restore);
        SetZ(this,(dVar5 * (double)iVar4) / 256.0 + this->floorz + 40.0,true);
      }
    }
  }
  else {
    SetZ(this,(this->ceilingz - this->Height) - (this->SpawnPoint).Z,true);
  }
  P_FindFloorCeiling(this,0xe);
  dVar5 = Z(this);
  if (dVar5 < this->floorz) {
    SetZ(this,this->floorz,true);
  }
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_44,
             iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
  uVar3 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_44);
  bVar2 = false;
  if (uVar3 != 0) {
    dVar5 = Top(this);
    bVar2 = this->ceilingz <= dVar5 && dVar5 != this->ceilingz;
  }
  if (bVar2) {
    SetZ(this,this->ceilingz - this->Height,true);
  }
  ClearInterpolation(this);
  return;
}

Assistant:

void AActor::RestoreSpecialPosition()
{
	// Move item back to its original location
	DVector2 sp = SpawnPoint;

	FLinkContext ctx;
	UnlinkFromWorld(&ctx);
	SetXY(sp);
	LinkToWorld(&ctx, true);
	SetZ(Sector->floorplane.ZatPoint(sp));
	P_FindFloorCeiling(this, FFCF_ONLYSPAWNPOS | FFCF_NOPORTALS);	// no portal checks here so that things get spawned in this sector.

	if (flags & MF_SPAWNCEILING)
	{
		SetZ(ceilingz - Height - SpawnPoint.Z);
	}
	else if (flags2 & MF2_SPAWNFLOAT)
	{
		double space = ceilingz - Height - floorz;
		if (space > 48)
		{
			space -= 40;
			SetZ((space * pr_restore()) / 256. + floorz + 40);
		}
		else
		{
			SetZ(floorz);
		}
	}
	else
	{
		SetZ(SpawnPoint.Z + floorz);
	}
	// Redo floor/ceiling check, in case of 3D floors and portals
	P_FindFloorCeiling(this, FFCF_SAMESECTOR | FFCF_ONLY3DFLOORS | FFCF_3DRESTRICT);
	if (Z() < floorz)
	{ // Do not reappear under the floor, even if that's where we were for the
	  // initial spawn.
		SetZ(floorz);
	}
	if ((flags & MF_SOLID) && (Top() > ceilingz))
	{ // Do the same for the ceiling.
		SetZ(ceilingz - Height);
	}
	// Do not interpolate from the position the actor was at when it was
	// picked up, in case that is different from where it is now.
	ClearInterpolation();
}